

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.hpp
# Opt level: O0

int __thiscall RingBuffer<short>::pull(RingBuffer<short> *this,short *data,uint size)

{
  short *psVar1;
  uint uVar2;
  uint *puVar3;
  int len;
  lock_guard<std::mutex> lock;
  short *psStack_18;
  uint size_local;
  short *data_local;
  RingBuffer<short> *this_local;
  
  lock._M_device._4_4_ = size;
  lock._M_device._0_4_ = filled(this);
  puVar3 = std::min<unsigned_int>((uint *)((long)&lock._M_device + 4),(uint *)&lock);
  lock._M_device._4_4_ = *puVar3;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffd8,&this->_mutex);
  uVar2 = lock._M_device._4_4_;
  psStack_18 = data;
  while (lock._M_device._4_4_ != 0) {
    if (this->_buffer + this->_size <= this->_readPtr) {
      this->_readPtr = this->_buffer;
    }
    psVar1 = this->_readPtr;
    this->_readPtr = psVar1 + 1;
    *psStack_18 = *psVar1;
    lock._M_device._4_4_ = lock._M_device._4_4_ - 1;
    psStack_18 = psStack_18 + 1;
  }
  lock._M_device._4_4_ = lock._M_device._4_4_ - 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffd8);
  return uVar2;
}

Assistant:

int pull(T* data, unsigned int size)
    {
        size = (std::min)(size, filled());
        std::lock_guard<std::mutex> lock{_mutex};
        int len = size;
        while(size--) {
            if( _readPtr >= _buffer + _size )
                _readPtr = _buffer;
            *data++ = *_readPtr++;
        }
        return len;
    }